

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTracer.cpp
# Opt level: O1

void __thiscall PathTracer::create_descriptor(PathTracer *this,shared_ptr<myvk::Device> *device)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  undefined8 uVar2;
  undefined8 uVar3;
  element_type *peVar4;
  _func_int **pp_Var5;
  element_type *peVar6;
  initializer_list<VkDescriptorPoolSize> __l;
  initializer_list<VkDescriptorSetLayoutBinding> __l_00;
  initializer_list<VkDescriptorSetLayoutBinding> __l_01;
  VkSampler immutable_samplers [1];
  allocator_type local_99;
  undefined1 local_98 [24];
  element_type *peStack_80;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  undefined1 local_70 [8];
  DescriptorSet local_68;
  undefined8 local_28;
  
  local_98._0_4_ = VK_DESCRIPTOR_TYPE_STORAGE_IMAGE;
  local_98._4_4_ = 3;
  local_98._8_8_ = (element_type *)0x100000001;
  __l._M_len = 2;
  __l._M_array = (iterator)local_98;
  std::vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>::vector
            ((vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_> *)&local_68,__l,
             (allocator_type *)local_70);
  myvk::DescriptorPool::Create
            ((DescriptorPool *)(local_98 + 0x10),device,2,
             (vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_> *)&local_68);
  peVar4 = peStack_80;
  uVar2 = local_98._16_8_;
  local_98._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peStack_80 = (element_type *)0x0;
  p_Var1 = (this->m_descriptor_pool).
           super___shared_ptr<myvk::DescriptorPool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->m_descriptor_pool).super___shared_ptr<myvk::DescriptorPool,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)uVar2;
  (this->m_descriptor_pool).super___shared_ptr<myvk::DescriptorPool,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar4;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if (peStack_80 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_80);
  }
  if (local_68.super_DeviceObjectBase.super_Base._vptr_Base != (_func_int **)0x0) {
    operator_delete(local_68.super_DeviceObjectBase.super_Base._vptr_Base,
                    (long)local_68.super_DeviceObjectBase.super_Base.
                          super_enable_shared_from_this<myvk::Base>._M_weak_this.
                          super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                    - (long)local_68.super_DeviceObjectBase.super_Base._vptr_Base);
  }
  local_68.super_DeviceObjectBase.super_Base._vptr_Base = (_func_int **)0x300000000;
  local_68.super_DeviceObjectBase.super_Base.super_enable_shared_from_this<myvk::Base>._M_weak_this.
  super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x3000000001;
  local_68.super_DeviceObjectBase.super_Base.super_enable_shared_from_this<myvk::Base>._M_weak_this.
  super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_68.m_descriptor_pool_ptr.
  super___shared_ptr<myvk::DescriptorPool,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x300000001;
  local_68.m_descriptor_pool_ptr.
  super___shared_ptr<myvk::DescriptorPool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3000000001;
  local_68.m_descriptor_set_layout_ptr.
  super___shared_ptr<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_68.m_descriptor_set_layout_ptr.
  super___shared_ptr<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x300000002;
  local_68.m_descriptor_set = (VkDescriptorSet)0x3000000001;
  local_28 = 0;
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)&local_68;
  std::vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>::vector
            ((vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_> *)
             (local_98 + 0x10),__l_00,(allocator_type *)local_70);
  myvk::DescriptorSetLayout::Create
            ((DescriptorSetLayout *)local_98,device,
             (vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_> *)
             (local_98 + 0x10));
  uVar3 = local_98._8_8_;
  uVar2 = local_98._0_8_;
  local_98._0_4_ = VK_DESCRIPTOR_TYPE_SAMPLER;
  local_98._4_4_ = 0;
  local_98._8_8_ = (element_type *)0x0;
  p_Var1 = (this->m_target_descriptor_set_layout).
           super___shared_ptr<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->m_target_descriptor_set_layout).
  super___shared_ptr<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)uVar2;
  (this->m_target_descriptor_set_layout).
  super___shared_ptr<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if ((element_type *)local_98._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._16_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    operator_delete((void *)local_98._16_8_,(long)local_78._M_pi - local_98._16_8_);
  }
  local_70 = (undefined1  [8])
             ((this->m_noise_sampler).super___shared_ptr<myvk::Sampler,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->m_sampler;
  local_98._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x100000000;
  peStack_80 = (element_type *)0x2000000001;
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)(local_98 + 0x10);
  local_78._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70;
  std::vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>::vector
            ((vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_> *)
             &local_68,__l_01,&local_99);
  myvk::DescriptorSetLayout::Create
            ((DescriptorSetLayout *)local_98,device,
             (vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_> *)
             &local_68);
  uVar3 = local_98._8_8_;
  uVar2 = local_98._0_8_;
  local_98._0_4_ = VK_DESCRIPTOR_TYPE_SAMPLER;
  local_98._4_4_ = 0;
  local_98._8_8_ = (element_type *)0x0;
  p_Var1 = (this->m_noise_descriptor_set_layout).
           super___shared_ptr<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->m_noise_descriptor_set_layout).
  super___shared_ptr<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)uVar2;
  (this->m_noise_descriptor_set_layout).
  super___shared_ptr<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if ((element_type *)local_98._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_);
  }
  if ((element_type *)local_68.super_DeviceObjectBase.super_Base._vptr_Base != (element_type *)0x0)
  {
    operator_delete(local_68.super_DeviceObjectBase.super_Base._vptr_Base,
                    (long)local_68.super_DeviceObjectBase.super_Base.
                          super_enable_shared_from_this<myvk::Base>._M_weak_this.
                          super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                    - (long)local_68.super_DeviceObjectBase.super_Base._vptr_Base);
  }
  myvk::DescriptorSet::Create
            (&local_68,&this->m_descriptor_pool,&this->m_target_descriptor_set_layout);
  peVar6 = local_68.super_DeviceObjectBase.super_Base.super_enable_shared_from_this<myvk::Base>.
           _M_weak_this.super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pp_Var5 = local_68.super_DeviceObjectBase.super_Base._vptr_Base;
  local_68.super_DeviceObjectBase.super_Base._vptr_Base = (_func_int **)0x0;
  local_68.super_DeviceObjectBase.super_Base.super_enable_shared_from_this<myvk::Base>._M_weak_this.
  super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  p_Var1 = (this->m_target_descriptor_set).
           super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->m_target_descriptor_set).
  super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pp_Var5;
  (this->m_target_descriptor_set).
  super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar6;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if (local_68.super_DeviceObjectBase.super_Base.super_enable_shared_from_this<myvk::Base>.
      _M_weak_this.super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_68.super_DeviceObjectBase.super_Base.super_enable_shared_from_this<myvk::Base>.
               _M_weak_this.super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  myvk::DescriptorSet::Create
            (&local_68,&this->m_descriptor_pool,&this->m_noise_descriptor_set_layout);
  peVar6 = local_68.super_DeviceObjectBase.super_Base.super_enable_shared_from_this<myvk::Base>.
           _M_weak_this.super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pp_Var5 = local_68.super_DeviceObjectBase.super_Base._vptr_Base;
  local_68.super_DeviceObjectBase.super_Base._vptr_Base = (_func_int **)0x0;
  local_68.super_DeviceObjectBase.super_Base.super_enable_shared_from_this<myvk::Base>._M_weak_this.
  super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  p_Var1 = (this->m_noise_descriptor_set).
           super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->m_noise_descriptor_set).super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)pp_Var5;
  (this->m_noise_descriptor_set).super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar6;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if (local_68.super_DeviceObjectBase.super_Base.super_enable_shared_from_this<myvk::Base>.
      _M_weak_this.super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_68.super_DeviceObjectBase.super_Base.super_enable_shared_from_this<myvk::Base>.
               _M_weak_this.super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  myvk::DescriptorSet::UpdateCombinedImageSampler
            ((this->m_noise_descriptor_set).
             super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &this->m_noise_sampler,&this->m_noise_image_view,0,0);
  return;
}

Assistant:

void PathTracer::create_descriptor(const std::shared_ptr<myvk::Device> &device) {
	m_descriptor_pool = myvk::DescriptorPool::Create(
	    device, 2, {{VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, 3}, {VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER, 1}});
	{
		VkDescriptorSetLayoutBinding color_binding = {};
		color_binding.binding = 0;
		color_binding.descriptorType = VK_DESCRIPTOR_TYPE_STORAGE_IMAGE;
		color_binding.descriptorCount = 1;
		color_binding.stageFlags = VK_SHADER_STAGE_COMPUTE_BIT | VK_SHADER_STAGE_FRAGMENT_BIT;

		VkDescriptorSetLayoutBinding albedo_binding = {};
		albedo_binding.binding = 1;
		albedo_binding.descriptorType = VK_DESCRIPTOR_TYPE_STORAGE_IMAGE;
		albedo_binding.descriptorCount = 1;
		albedo_binding.stageFlags = VK_SHADER_STAGE_COMPUTE_BIT | VK_SHADER_STAGE_FRAGMENT_BIT;

		VkDescriptorSetLayoutBinding normal_binding = {};
		normal_binding.binding = 2;
		normal_binding.descriptorType = VK_DESCRIPTOR_TYPE_STORAGE_IMAGE;
		normal_binding.descriptorCount = 1;
		normal_binding.stageFlags = VK_SHADER_STAGE_COMPUTE_BIT | VK_SHADER_STAGE_FRAGMENT_BIT;

		m_target_descriptor_set_layout =
		    myvk::DescriptorSetLayout::Create(device, {color_binding, albedo_binding, normal_binding});
	}

	{
		VkDescriptorSetLayoutBinding noise_binding = {};
		noise_binding.binding = 0;
		noise_binding.descriptorType = VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER;
		noise_binding.descriptorCount = 1;
		noise_binding.stageFlags = VK_SHADER_STAGE_COMPUTE_BIT;
		VkSampler immutable_samplers[] = {m_noise_sampler->GetHandle()};
		noise_binding.pImmutableSamplers = immutable_samplers;

		m_noise_descriptor_set_layout = myvk::DescriptorSetLayout::Create(device, {noise_binding});
	}
	m_target_descriptor_set = myvk::DescriptorSet::Create(m_descriptor_pool, m_target_descriptor_set_layout);

	m_noise_descriptor_set = myvk::DescriptorSet::Create(m_descriptor_pool, m_noise_descriptor_set_layout);
	m_noise_descriptor_set->UpdateCombinedImageSampler(m_noise_sampler, m_noise_image_view, 0);
}